

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  deUint32 type;
  float height;
  float width;
  int iVar1;
  int y;
  deUint32 dVar2;
  char *str;
  size_type __n;
  reference pvVar3;
  iterator first;
  iterator last;
  void *data;
  int local_164;
  PixelBufferAccess local_158;
  PixelBufferAccess local_130;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  undefined1 local_e8 [8];
  Vec4 gMax;
  Vector<float,_4> local_c8;
  undefined1 local_b8 [8];
  Vec4 gMin;
  int levelH;
  int levelW;
  int levelNdx;
  int ndx;
  int local_88;
  allocator<int> local_81;
  int i;
  vector<int,_std::allocator<int>_> levels;
  undefined1 local_58 [8];
  Random rnd;
  TextureLevel levelData;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  RandomOrderTexImage2DCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_164 = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    y = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_164 = de::max<int>(iVar1,y);
    local_164 = local_164 + 1;
  }
  levelData.m_data.m_cap._4_4_ = local_164;
  levelData.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar2);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)&levelData.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,
             (deUint32)levelData.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  __n = (size_type)levelData.m_data.m_cap._4_4_;
  std::allocator<int>::allocator(&local_81);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,__n,&local_81);
  std::allocator<int>::~allocator(&local_81);
  for (local_88 = 0; local_88 < levelData.m_data.m_cap._4_4_; local_88 = local_88 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)local_88);
    *pvVar3 = local_88;
  }
  first = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i);
  last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_58,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current);
  for (levelW = 0; levelW < levelData.m_data.m_cap._4_4_; levelW = levelW + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)levelW);
    iVar1 = *pvVar3;
    levelH._0_1_ = (byte)iVar1;
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    gMin.m_data[2] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_c8,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
    randomVector<4>((Functional *)local_b8,(Random *)local_58,&local_c8,
                    (Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_f8,0.0);
    tcu::Vector<float,_4>::Vector(&local_108,1.0);
    randomVector<4>((Functional *)local_e8,(Random *)local_58,&local_f8,&local_108);
    tcu::TextureLevel::setSize
              ((TextureLevel *)&rnd.m_rnd.z,(int)gMin.m_data[3],(int)gMin.m_data[2],1);
    tcu::TextureLevel::getAccess(&local_130,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_130,(Vec4 *)local_b8,(Vec4 *)local_e8);
    width = gMin.m_data[3];
    height = gMin.m_data[2];
    dVar2 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_158,(TextureLevel *)&rnd.m_rnd.z);
    data = tcu::PixelBufferAccess::getDataPtr(&local_158);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,iVar1,dVar2,(int)width,
               (int)height,0,dVar2,type,data);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(numLevels);

		for (int i = 0; i < numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}